

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

transaction_base * __thiscall pstore::transaction_base::commit(transaction_base *this)

{
  typed_address<pstore::trailer> addr;
  long lVar1;
  element_type *this_00;
  uint32_t uVar2;
  uint64_t uVar3;
  uint generation;
  typed_address<pstore::trailer> new_footer_pos;
  shared_ptr<pstore::trailer> trailer_ptr;
  shared_ptr<const_pstore::trailer> prev_footer;
  pair<std::shared_ptr<pstore::trailer>,_pstore::typed_address<pstore::trailer>_> local_80;
  index_records_array locations;
  file_base *local_38;
  shared_ptr<pstore::trailer> *local_30;
  
  if ((this->first_).a_ != 0) {
    addr.a_.a_ = (address)this->db_;
    new_footer_pos.a_.a_ = (address)0;
    lVar1 = *(long *)((long)addr.a_.a_ + 0x48);
    database::getro<pstore::trailer,void>((database *)&prev_footer,addr);
    generation = ((prev_footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->a).generation.super___atomic_base<unsigned_int>._M_i + 1;
    locations._M_elems[0].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[0].a_.a_;
    locations._M_elems[1].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[1].a_.a_;
    locations._M_elems[2].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[2].a_.a_;
    locations._M_elems[3].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[3].a_.a_;
    locations._M_elems[4].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[4].a_.a_;
    locations._M_elems[5].a_.a_ =
         (address)((prev_footer.
                    super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a
                  ).index_records._M_elems[5].a_.a_;
    index::flush_indices(this,&locations,generation);
    trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    alloc_rw<pstore::trailer,void>(&local_80,this,1);
    local_38 = (file_base *)&new_footer_pos;
    local_30 = &trailer_ptr;
    std::tuple<std::shared_ptr<pstore::trailer>&,pstore::typed_address<pstore::trailer>&>::operator=
              ((tuple<std::shared_ptr<pstore::trailer>&,pstore::typed_address<pstore::trailer>&> *)
               &local_38,&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.first.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_00 = trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined8 *)
     ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
     signature1._M_elems = 0x546f6f6679505068;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    generation = (__atomic_base<unsigned_int>)0x0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    unused1 = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).size.
    super___atomic_base<unsigned_long>._M_i = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).time.
    super___atomic_base<unsigned_long>._M_i = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    prev_generation.a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[0].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[1].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[2].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[3].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[4].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[5].a_.a_ = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    unused2 = 0;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    unused3 = 0;
    (trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->crc = 0;
    (trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->unused1 =
         0;
    *(undefined8 *)
     ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     signature2)._M_elems = 0x6c69615479505068;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[0].a_.a_ = (value_type)locations._M_elems[0].a_.a_;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[1].a_.a_ = (value_type)locations._M_elems[1].a_.a_;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[2].a_.a_ = (value_type)locations._M_elems[2].a_.a_;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[3].a_.a_ = (value_type)locations._M_elems[3].a_.a_;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[4].a_.a_ = (value_type)locations._M_elems[4].a_.a_;
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    index_records._M_elems[5].a_.a_ = (value_type)locations._M_elems[5].a_.a_;
    LOCK();
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).
    generation.super___atomic_base<unsigned_int>._M_i = generation;
    UNLOCK();
    LOCK();
    ((trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->a).size.
    super___atomic_base<unsigned_long>._M_i = this->size_ - 0x70;
    UNLOCK();
    uVar3 = milliseconds_since_epoch();
    LOCK();
    (this_00->a).time.super___atomic_base<unsigned_long>._M_i = uVar3;
    UNLOCK();
    (this_00->a).prev_generation.a_.a_ = *(value_type *)(lVar1 + 0x28);
    uVar2 = trailer::get_crc(this_00);
    this_00->crc = uVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trailer_ptr.super___shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&prev_footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    database::set_new_footer((database *)addr.a_.a_,new_footer_pos);
    storage::protect((storage *)((long)addr.a_.a_ + 8),(address)(this->first_).a_,
                     new_footer_pos.a_.a_ + 0x70);
    (this->first_).a_ = 0;
  }
  return this;
}

Assistant:

transaction_base & transaction_base::commit () {
        if (!this->is_open ()) {
            // No data was added to the transaction. Nothing to do.
            return *this;
        }

        database & db = this->db ();

        // We're going to write to the header, but this must be the very last
        // step of completing the transaction.
        auto new_footer_pos = typed_address<trailer>::null ();
        {
            auto const & head = db.get_header ();
            auto const prev_footer = db.getro (head.footer_pos.load ());

            unsigned const generation = prev_footer->a.generation + 1;

            // Make a copy of the index locations; write out any modifications to the indices.
            // Any updated indices will modify the 'locations' array.
            //
            // This must happen before the transaction is final because we're allocating and
            // writing data here.

            auto locations = prev_footer->a.index_records;
            index::flush_indices (*this, &locations, generation);

            // Writing new data is done. Now we begin to build the new file footer.
            {
                std::shared_ptr<trailer> trailer_ptr;
                std::tie (trailer_ptr, new_footer_pos) = this->alloc_rw<trailer> ();
                auto * const t = new (trailer_ptr.get ()) trailer;

                t->a.index_records = locations;

                // Point the new header at the previous version.
                t->a.generation = generation;
                // The size of the transaction doesn't include the size of the footer record.
                t->a.size = size_ - sizeof (trailer);
                t->a.time = pstore::milliseconds_since_epoch ();
                t->a.prev_generation = head.footer_pos;
                t->crc = t->get_crc ();
            }
        }
        // Complete the transaction by making it available to other clients. This modifies the
        // footer pointer in the file's header record.
        db.set_new_footer (new_footer_pos);

        // Mark both this transaction's contents and its trailer as read-only.
        db.protect (first_, (new_footer_pos + 1).to_address ());

        // That's the end of this transaction.
        first_ = address::null ();
        PSTORE_ASSERT (!this->is_open ()); //! OCLINT(PH - don't warn about the assert macro)
        return *this;
    }